

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::ruby::DefaultValueForField_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  ruby rVar1;
  EnumValueDescriptor *pEVar2;
  ostream *poVar3;
  int value;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  string default_str;
  ostringstream os;
  ruby *local_1d8;
  ulong local_1d0;
  ruby local_1c8 [16];
  ruby *local_1b8;
  _func_void_FieldDescriptor_ptr *local_1b0;
  _func_void_FieldDescriptor_ptr *local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_1a8[0] = FieldDescriptor::TypeOnceInit;
    local_1d8 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),local_1a8,(FieldDescriptor **)&local_1d8);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
    value = *(int *)(this + 0x40);
    goto LAB_0028f346;
  case 2:
    NumberToString<long>(__return_storage_ptr__,*(long *)(this + 0x40));
    break;
  case 3:
    NumberToString<unsigned_int>(__return_storage_ptr__,*(uint *)(this + 0x40));
    break;
  case 4:
    NumberToString<unsigned_long>(__return_storage_ptr__,*(unsigned_long *)(this + 0x40));
    break;
  case 5:
    NumberToString<double>(__return_storage_ptr__,*(double *)(this + 0x40));
    break;
  case 6:
    NumberToString<float>(__return_storage_ptr__,*(float *)(this + 0x40));
    break;
  case 7:
    rVar1 = this[0x40];
    pcVar6 = "false";
    if ((ulong)(byte)rVar1 != 0) {
      pcVar6 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar6,pcVar6 + ((ulong)(byte)rVar1 ^ 5));
    break;
  case 8:
    pEVar2 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    value = *(int *)(pEVar2 + 4);
LAB_0028f346:
    NumberToString<int>(__return_storage_ptr__,value);
    break;
  case 9:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_1d8 = local_1c8;
    lVar4 = **(long **)(this + 0x40);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,lVar4,(*(long **)(this + 0x40))[1] + lVar4);
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_1b0 = FieldDescriptor::TypeOnceInit;
      local_1b8 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),&local_1b0,(FieldDescriptor **)&local_1b8);
    }
    rVar1 = this[2];
    if (rVar1 == (ruby)0x9) {
      pcVar6 = "\"";
      lVar4 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1d8,local_1d0);
LAB_0028f53b:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar4);
    }
    else {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_1b0 = FieldDescriptor::TypeOnceInit;
        local_1b8 = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x18),&local_1b0,(FieldDescriptor **)&local_1b8);
        rVar1 = this[2];
      }
      if (rVar1 == (ruby)0xc) {
        poVar3 = (ostream *)local_1a8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
        lVar4 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar4 + 1] == '\0') {
          std::ios::widen((char)&local_1d8 + (char)lVar4 + '0');
          acStack_c8[lVar4 + 1] = '\x01';
        }
        acStack_c8[lVar4] = '0';
        lVar4 = 0x1e;
        pcVar6 = "\".force_encoding(\"ASCII-8BIT\")";
        if (local_1d0 != 0) {
          uVar5 = 0;
          poVar3 = (ostream *)local_1a8;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\\x",2);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
            if (local_1d0 <= uVar5) {
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                        );
              goto switchD_0028f2fe_default;
            }
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            uVar5 = uVar5 + 1;
          } while (uVar5 < local_1d0);
        }
        goto LAB_0028f53b;
      }
    }
    std::__cxx11::stringbuf::str();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    break;
  default:
switchD_0028f2fe_default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                  ,0xa8,
                  "std::string google::protobuf::compiler::ruby::DefaultValueForField(const FieldDescriptor *)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValueForField(const FieldDescriptor* field) {
  switch(field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return NumberToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_INT64:
      return NumberToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT32:
      return NumberToString(field->default_value_uint32());
    case FieldDescriptor::CPPTYPE_UINT64:
      return NumberToString(field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_FLOAT:
      return NumberToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return NumberToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      return NumberToString(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING: {
      std::ostringstream os;
      std::string default_str = field->default_value_string();

      if (field->type() == FieldDescriptor::TYPE_STRING) {
        os << "\"" << default_str << "\"";
      } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
        os << "\"";

        os.fill('0');
        for (int i = 0; i < default_str.length(); ++i) {
          // Write the hex form of each byte.
          os << "\\x" << std::hex << std::setw(2)
             << ((uint16)((unsigned char)default_str.at(i)));
        }
        os << "\".force_encoding(\"ASCII-8BIT\")";
      }

      return os.str();
    }
    default: assert(false); return "";
  }
}